

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

Vec_Ptr_t *
Abc_GiaDeriveSops(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,Vec_Wec_t *vSupps,int nCubeLim,int nBTLimit,
                 int nCostMax,int fCanon,int fReverse,int fCnfShared,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Wec_t *__ptr;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *__ptr_00;
  uint *__ptr_01;
  void *pvVar7;
  ProgressBar *p_00;
  Vec_Str_t *__ptr_02;
  char *pcVar8;
  void **__s;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint nItemsTotal;
  long lVar13;
  Vec_Int_t *local_98;
  Vec_Ptr_t *local_80;
  Cnf_Dat_t *local_70;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  __ptr = Gia_ManIsoStrashReduceInt(p,vSupps,0);
  if (fVerbose != 0) {
    printf("Considering %d (out of %d) outputs. ",(ulong)(uint)__ptr->nSize,
           (ulong)(uint)p->vCos->nSize);
    iVar3 = 3;
    iVar1 = clock_gettime(3,(timespec *)&ts);
    if (iVar1 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar3,"%s =","Reduction time");
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar13 + lVar10) / 1000000.0);
  }
  iVar1 = __ptr->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar3;
  nItemsTotal = 0;
  if (iVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar4->pArray = piVar5;
  if (0 < iVar1) {
    lVar10 = 8;
    lVar13 = 0;
    do {
      if (0 < *(int *)((long)__ptr->pArray + lVar10 + -4)) {
        Vec_IntPush(pVVar4,**(int **)((long)&__ptr->pArray->nCap + lVar10));
        iVar1 = __ptr->nSize;
      }
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar13 < iVar1);
    nItemsTotal = pVVar4->nSize;
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar9 = nItemsTotal - 1;
  uVar2 = 0x10;
  if (0xe < uVar9) {
    uVar2 = nItemsTotal;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar2;
  iVar1 = 0;
  if (uVar2 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar2 << 2);
  }
  pVVar6->pArray = piVar5;
  if (0 < (int)nItemsTotal) {
    piVar5 = pVVar4->pArray;
    uVar11 = 0;
    do {
      iVar1 = piVar5[uVar11];
      if (((long)iVar1 < 0) || (vSupps->nSize <= iVar1)) goto LAB_00244a0c;
      Vec_IntPush(pVVar6,vSupps->pArray[iVar1].nSize);
      uVar11 = uVar11 + 1;
    } while (nItemsTotal != uVar11);
    piVar5 = pVVar6->pArray;
    iVar1 = pVVar6->nSize;
  }
  __ptr_00 = Abc_MergeSortCost(piVar5,iVar1);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar6);
  if (fCnfShared == 0) {
    local_70 = (Cnf_Dat_t *)0x0;
    local_98 = (Vec_Int_t *)0x0;
  }
  else {
    iVar1 = p->nObjs;
    local_98 = (Vec_Int_t *)malloc(0x10);
    iVar3 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar3 = iVar1;
    }
    local_98->nCap = iVar3;
    if (iVar3 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar3 << 2);
    }
    local_98->pArray = piVar5;
    local_98->nSize = iVar1;
    memset(piVar5,0xff,(long)iVar1 << 2);
    local_70 = Mf_ManGenerateCnf(p,8,1,0,0);
  }
  __ptr_01 = (uint *)malloc(0x10);
  uVar2 = 8;
  if (6 < uVar9) {
    uVar2 = nItemsTotal;
  }
  *__ptr_01 = uVar2;
  if (uVar2 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar2 << 3);
  }
  *(void **)(__ptr_01 + 2) = pvVar7;
  __ptr_01[1] = nItemsTotal;
  memset(pvVar7,0,(long)(int)nItemsTotal * 8);
  p_00 = Extra_ProgressBarStart(_stdout,nItemsTotal);
  if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext < 1)) {
    Extra_ProgressBarUpdate_int(p_00,0,(char *)0x0);
  }
  if (0 < (int)nItemsTotal) {
    local_80 = (Vec_Ptr_t *)0x0;
    uVar11 = 0;
    do {
      uVar2 = __ptr_00[(int)uVar9];
      uVar12 = (ulong)uVar2;
      if (nItemsTotal <= uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar4->pArray[uVar12];
      lVar10 = (long)iVar1;
      if ((lVar10 < 0) || (vSupps->nSize <= iVar1)) goto LAB_00244a0c;
      if (vSupps->pArray[lVar10].nSize < 2) {
        *(undefined8 *)((long)pvVar7 + uVar12 * 8) = 1;
      }
      else {
        pVVar6 = vSupps->pArray + lVar10;
        if (fCanon == 0 && fCnfShared != 0) {
          if (__ptr->nSize <= (int)uVar2) {
LAB_00244a0c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          iVar3 = 0;
          if (uVar11 == 0) {
            iVar3 = fVerbose;
          }
          __ptr_02 = Abc_NtkClpGiaOne2(local_70,p,iVar1,nCubeLim,nBTLimit,0,fReverse,pVVar6,local_98
                                       ,iVar3,__ptr->pArray + uVar12,vSupps);
        }
        else {
          if (__ptr->nSize <= (int)uVar2) goto LAB_00244a0c;
          iVar3 = 0;
          if (uVar11 == 0) {
            iVar3 = fVerbose;
          }
          __ptr_02 = Abc_NtkClpGiaOne(p,iVar1,nCubeLim,nBTLimit,fCanon,fReverse,pVVar6,iVar3,
                                      __ptr->pArray + uVar12,vSupps);
        }
        if (__ptr_02 == (Vec_Str_t *)0x0) goto LAB_0024493b;
        if (vSupps->nSize <= iVar1) goto LAB_00244a0c;
        iVar1 = vSupps->pArray[lVar10].nSize;
        iVar3 = Abc_SopGetVarNum(__ptr_02->pArray);
        if (iVar1 != iVar3) {
          __assert_fail("Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                        ,0x33b,
                        "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                       );
        }
        if ((p_00 == (ProgressBar *)0x0) || ((long)p_00->nItemsNext <= (long)uVar11)) {
          Extra_ProgressBarUpdate_int(p_00,(int)uVar11,(char *)0x0);
        }
        pcVar8 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,__ptr_02->pArray);
        *(char **)((long)pvVar7 + uVar12 * 8) = pcVar8;
        if (__ptr_02->pArray != (char *)0x0) {
          free(__ptr_02->pArray);
        }
        free(__ptr_02);
      }
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 - 1;
    } while (nItemsTotal != uVar11);
  }
  Extra_ProgressBarStop(p_00);
  if (fCnfShared != 0) {
    Cnf_DataFree(local_70);
    if (local_98->pArray != (int *)0x0) {
      free(local_98->pArray);
    }
    free(local_98);
  }
  uVar9 = p->vCos->nSize;
  local_80 = (Vec_Ptr_t *)malloc(0x10);
  uVar2 = 8;
  if (6 < uVar9 - 1) {
    uVar2 = uVar9;
  }
  local_80->nCap = uVar2;
  if (uVar2 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar2 << 3);
  }
  local_80->pArray = __s;
  local_80->nSize = uVar9;
  memset(__s,0,(long)(int)uVar9 << 3);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    lVar10 = 0;
    do {
      pVVar6 = __ptr->pArray;
      uVar2 = pVVar6[lVar10].nSize;
      if (0 < (int)uVar2) {
        if ((int)nItemsTotal <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar11 = 0;
        do {
          iVar3 = pVVar6[lVar10].pArray[uVar11];
          if (((long)iVar3 < 0) || ((int)uVar9 <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          __s[iVar3] = *(void **)((long)pvVar7 + lVar10 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  if (0 < (int)uVar9) {
    uVar11 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(__s[uVar11] == (void *)0x0);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
    if (iVar1 != 0) {
      __assert_fail("Vec_PtrCountZero(vSops) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                    ,0x34b,
                    "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                   );
    }
  }
  if (__ptr_00 != (int *)0x0) {
LAB_0024493b:
    free(__ptr_00);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  iVar1 = __ptr->nCap;
  pVVar4 = __ptr->pArray;
  if (iVar1 < 1) {
    if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_002449b7;
  }
  else {
    lVar10 = 8;
    lVar13 = 0;
    do {
      pvVar7 = *(void **)((long)&pVVar4->nCap + lVar10);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        pVVar4 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar4->nCap + lVar10) = 0;
        iVar1 = __ptr->nCap;
      }
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar13 < iVar1);
  }
  free(pVVar4);
  pvVar7 = *(void **)(__ptr_01 + 2);
LAB_002449b7:
  free(__ptr);
  if (pvVar7 != (void *)0x0) {
    free(pvVar7);
  }
  free(__ptr_01);
  return local_80;
}

Assistant:

Vec_Ptr_t * Abc_GiaDeriveSops( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, Vec_Wec_t * vSupps, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    ProgressBar * pProgress;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vSops = NULL, * vSopsRepr;
    Vec_Int_t * vReprs, * vClass, * vReprSuppSizes;
    int i, k, Entry, iCo, * pOrder;
    Vec_Wec_t * vClasses;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vMap = NULL;
    // derive classes of outputs
    vClasses = Gia_ManIsoStrashReduceInt( p, vSupps, 0 );
    if ( fVerbose )
    {
        printf( "Considering %d (out of %d) outputs. ", Vec_WecSize(vClasses), Gia_ManCoNum(p) );
        Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    }
    // derive representatives
    vReprs = Vec_WecCollectFirsts( vClasses );
    vReprSuppSizes = Vec_IntAlloc( Vec_IntSize(vReprs) );
    Vec_IntForEachEntry( vReprs, Entry, i )
        Vec_IntPush( vReprSuppSizes, Vec_IntSize(Vec_WecEntry(vSupps, Entry)) );
    pOrder = Abc_MergeSortCost( Vec_IntArray(vReprSuppSizes), Vec_IntSize(vReprSuppSizes) );
    Vec_IntFree( vReprSuppSizes );
    // consider SOPs for representatives
    if ( fCnfShared )
    {
        vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
        pCnf = Mf_ManGenerateCnf( p, 8, 1, 0, 0 );
    }
    vSopsRepr = Vec_PtrStart( Vec_IntSize(vReprs) );
    pProgress = Extra_ProgressBarStart( stdout, Vec_IntSize(vReprs) );
    Extra_ProgressBarUpdate( pProgress, 0, NULL );
    for ( i = 0; i < Vec_IntSize(vReprs); i++ )
    {
        int iEntry        = pOrder[Vec_IntSize(vReprs) - 1 - i];
        int iCoThis       = Vec_IntEntry( vReprs, iEntry );
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, iCoThis );
        Vec_Str_t * vSop;
        if ( Vec_IntSize(vSupp) < 2 )
        {
            Vec_PtrWriteEntry( vSopsRepr, iEntry, (void *)(ABC_PTRINT_T)1 );
            continue;
        }
        if ( fCnfShared && !fCanon )
            vSop = Abc_NtkClpGiaOne2( pCnf, p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, vMap, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        else
            vSop = Abc_NtkClpGiaOne( p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        if ( vSop == NULL )
            goto finish;
        assert( Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop)) );
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Vec_PtrWriteEntry( vSopsRepr, iEntry, Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vSop) ) );
        Vec_StrFree( vSop );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fCnfShared )
    {
        Cnf_DataFree( pCnf );
        Vec_IntFree( vMap );
    }
    // derive SOPs for each output
    vSops = Vec_PtrStart( Gia_ManCoNum(p) );
    Vec_WecForEachLevel ( vClasses, vClass, i )
        Vec_IntForEachEntry( vClass, iCo, k )
            Vec_PtrWriteEntry( vSops, iCo, Vec_PtrEntry(vSopsRepr, i) );
    assert( Vec_PtrCountZero(vSops) == 0 );
/*
    // verify
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, i );
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        assert( Vec_IntSize(vSupp) == Abc_SopGetVarNum(pSop) );
    }
*/
    // cleanup
finish:
    ABC_FREE( pOrder );
    Vec_IntFree( vReprs );
    Vec_WecFree( vClasses );
    Vec_PtrFree( vSopsRepr );
    return vSops;
}